

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

bool __thiscall QFileDevice::unmap(QFileDevice *this,uchar *address)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  QFileDevicePrivate *this_00;
  undefined4 extraout_var;
  pointer pQVar4;
  long in_FS_OFFSET;
  bool success;
  QFileDevicePrivate *d;
  FileError in_stack_ffffffffffffff7c;
  QFileDevicePrivate *in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  bool local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFileDevice *)0x2a8df5);
  iVar2 = (*(this_00->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.
            _vptr_QObjectData[7])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    pQVar4 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x2a8e20);
    uVar3 = (*pQVar4->_vptr_QAbstractFileEngine[0x27])(pQVar4,3);
    if ((uVar3 & 1) != 0) {
      unsetError((QFileDevice *)in_stack_ffffffffffffff80);
      std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                 0x2a8e55);
      local_39 = QAbstractFileEngine::unmap
                           ((QAbstractFileEngine *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88);
      if (!local_39) {
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x2a8e8a);
        QAbstractFileEngine::error((QAbstractFileEngine *)in_stack_ffffffffffffff80);
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x2a8ea7);
        QAbstractFileEngine::errorString((QAbstractFileEngine *)this_00);
        QFileDevicePrivate::setError
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(QString *)0x2a8ec7);
        QString::~QString((QString *)0x2a8ed1);
      }
      goto LAB_002a8f24;
    }
  }
  tr((char *)in_stack_ffffffffffffff88,(char *)this_00,in_stack_ffffffffffffff7c);
  QFileDevicePrivate::setError(this_00,in_stack_ffffffffffffff7c,(QString *)0x2a8f15);
  QString::~QString((QString *)0x2a8f1f);
  local_39 = false;
LAB_002a8f24:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool QFileDevice::unmap(uchar *address)
{
    Q_D(QFileDevice);
    if (d->engine()
        && d->fileEngine->supportsExtension(QAbstractFileEngine::UnMapExtension)) {
        unsetError();
        bool success = d->fileEngine->unmap(address);
        if (!success)
            d->setError(d->fileEngine->error(), d->fileEngine->errorString());
        return success;
    }
    d->setError(PermissionsError, tr("No file engine available or engine does not support UnMapExtension"));
    return false;
}